

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::update_active_builtins(Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  anon_class_16_2_f77679f7 local_40 [2];
  undefined1 local_20 [8];
  ActiveBuiltinHandler handler;
  Compiler *this_local;
  
  handler.compiler = this;
  Bitset::reset(&this->active_input_builtins);
  Bitset::reset(&this->active_output_builtins);
  this->cull_distance_count = 0;
  this->clip_distance_count = 0;
  ActiveBuiltinHandler::ActiveBuiltinHandler((ActiveBuiltinHandler *)local_20,this);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<spirv_cross::SPIRFunction>(this,id);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_20);
  local_40[0].handler = (ActiveBuiltinHandler *)local_20;
  local_40[0].this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::Compiler::update_active_builtins()::__0>
            (&this->ir,local_40);
  ActiveBuiltinHandler::~ActiveBuiltinHandler((ActiveBuiltinHandler *)local_20);
  return;
}

Assistant:

void Compiler::update_active_builtins()
{
	active_input_builtins.reset();
	active_output_builtins.reset();
	cull_distance_count = 0;
	clip_distance_count = 0;
	ActiveBuiltinHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage != StorageClassOutput)
			return;
		if (!interface_variable_exists_in_entry_point(var.self))
			return;

		// Also, make sure we preserve output variables which are only initialized, but never accessed by any code.
		if (var.initializer != ID(0))
			handler.add_if_builtin_or_block(var.self);
	});
}